

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O0

void __thiscall r_exec::PTPX::reduce(PTPX *this,View *input)

{
  bool bVar1;
  short sVar2;
  undefined2 uVar3;
  int iVar4;
  uint64_t analysis_starting_time_00;
  Code *object;
  Fact *f;
  BindingMap *pBVar5;
  Code *o;
  BindingMap *bm;
  uint64_t uVar6;
  Input *pIVar7;
  _Fact *p_Var8;
  undefined4 extraout_var;
  uint64_t uVar9;
  TimingGuardBuilder *this_00;
  GuardBuilder *pGVar10;
  undefined4 extraout_var_00;
  long *plVar11;
  undefined4 extraout_var_01;
  Code **cst_00;
  undefined8 extraout_RDX;
  list<r_exec::Input> *destination;
  iterator iVar12;
  const_iterator cVar13;
  _Fact *cause_pattern;
  Code *cst;
  Code *unpacked_cst;
  _Fact *f_icst;
  Code *new_cst;
  undefined1 local_f0 [2];
  uint16_t cause_index;
  Input cause;
  iterator local_b8;
  uint64_t local_a8;
  uint64_t period;
  P<r_exec::GuardBuilder> guard_builder;
  const_iterator local_88;
  iterator local_78;
  iterator local_68;
  undefined1 local_58 [8];
  const_iterator i;
  P<r_exec::_Fact> abstract_input;
  P<r_exec::BindingMap> end_bm;
  _Fact *consequent;
  uint64_t analysis_starting_time;
  View *input_local;
  PTPX *this_local;
  
  destination = &(this->super__TPX).inputs;
  AutoFocusController::copy_cross_buffer((this->super__TPX).super_TPX.auto_focus,destination);
  analysis_starting_time_00 = (*Now)();
  object = (Code *)Fact::operator_new((Fact *)0x150,(size_t)destination);
  f = core::P::operator_cast_to_Fact_((P *)&this->f_imdl);
  Fact::Fact((Fact *)object,f);
  _Fact::set_opposite((_Fact *)object);
  pBVar5 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(pBVar5);
  core::P<r_exec::BindingMap>::P((P<r_exec::BindingMap> *)&abstract_input,pBVar5);
  pBVar5 = core::P<r_exec::BindingMap>::operator->((P<r_exec::BindingMap> *)&abstract_input);
  o = BindingMap::abstract_object(pBVar5,object,false);
  core::P<r_exec::_Fact>::P((P<r_exec::_Fact> *)&i._list,(_Fact *)o);
  r_code::list<r_exec::Input>::const_iterator::const_iterator((const_iterator *)local_58);
  local_68 = r_code::list<r_exec::Input>::begin(&(this->super__TPX).inputs);
  r_code::list<r_exec::Input>::const_iterator::operator=((const_iterator *)local_58,&local_68);
  do {
    while( true ) {
      while( true ) {
        iVar12 = r_code::list<r_exec::Input>::end(&(this->super__TPX).inputs);
        local_78 = iVar12;
        bVar1 = r_code::list<r_exec::Input>::_iterator::operator!=
                          ((_iterator *)local_58,&local_78.super__iterator);
        if (!bVar1) {
          core::P<r_exec::GuardBuilder>::P((P<r_exec::GuardBuilder> *)&period);
          local_b8 = r_code::list<r_exec::Input>::begin(&(this->super__TPX).inputs);
          r_code::list<r_exec::Input>::const_iterator::operator=
                    ((const_iterator *)local_58,&local_b8);
          while( true ) {
            iVar12 = r_code::list<r_exec::Input>::end(&(this->super__TPX).inputs);
            cause.ijt = (uint64_t)iVar12.super__iterator._cell;
            bVar1 = r_code::list<r_exec::Input>::_iterator::operator!=
                              ((_iterator *)local_58,(_iterator *)&cause.ijt);
            if (!bVar1) break;
            pIVar7 = r_code::list<r_exec::Input>::const_iterator::operator->
                               ((const_iterator *)local_58);
            p_Var8 = core::P<r_exec::_Fact>::operator->(&pIVar7->input);
            iVar4 = (*(p_Var8->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                      super_LObject.super_Code.super__Object._vptr__Object[9])(p_Var8,0);
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x20))
                      ((long *)CONCAT44(extraout_var,iVar4),0);
            sVar2 = r_code::Atom::asOpcode();
            if (sVar2 != Opcodes::ICst) {
              pIVar7 = r_code::list<r_exec::Input>::const_iterator::operator*
                                 ((const_iterator *)local_58);
              Input::Input((Input *)local_f0,pIVar7);
              if (((byte)cause.input.object & 1) == 0) {
                new_cst._4_4_ = 6;
              }
              else {
                uVar9 = _Fact::get_after((_Fact *)object);
                p_Var8 = core::P<r_exec::_Fact>::operator->(&cause.abstraction);
                local_a8 = _Fact::get_after(p_Var8);
                local_a8 = uVar9 - local_a8;
                this_00 = (TimingGuardBuilder *)operator_new(0x18);
                TimingGuardBuilder::TimingGuardBuilder(this_00,local_a8);
                core::P<r_exec::GuardBuilder>::operator=
                          ((P<r_exec::GuardBuilder> *)&period,(GuardBuilder *)this_00);
                p_Var8 = core::P::operator_cast_to__Fact_((P *)&cause.abstraction);
                cst_00 = (Code **)&f_icst;
                p_Var8 = _TPX::find_f_icst(&this->super__TPX,p_Var8,(uint16_t *)((long)&new_cst + 2)
                                           ,cst_00);
                if (p_Var8 == (_Fact *)0x0) {
                  p_Var8 = core::P::operator_cast_to__Fact_((P *)&cause.abstraction);
                  pGVar10 = core::P::operator_cast_to_GuardBuilder_((P *)&period);
                  bVar1 = build_mdl(this,p_Var8,(_Fact *)object,pGVar10,local_a8);
                  if (bVar1) {
                    _TPX::inject_hlps(&this->super__TPX,analysis_starting_time_00);
                  }
                }
                else {
                  if (f_icst == (_Fact *)0x0) {
                    iVar4 = (*(p_Var8->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>
                              .super_LObject.super_Code.super__Object._vptr__Object[9])(p_Var8,0);
                    plVar11 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x48))
                                                ((long *)CONCAT44(extraout_var_00,iVar4),0);
                    uVar3 = (**(code **)(*plVar11 + 0x50))();
                    iVar4 = (int)CONCAT62((int6)((ulong)cst_00 >> 0x10),uVar3) + -1;
                    cst = (Code *)(**(code **)(*plVar11 + 0x48))
                                            (plVar11,(short)iVar4,extraout_RDX,iVar4);
                  }
                  else {
                    cst = (Code *)f_icst;
                  }
                  iVar4 = (*(cst->super__Object)._vptr__Object[9])(cst,(ulong)new_cst._2_2_);
                  pGVar10 = core::P::operator_cast_to_GuardBuilder_((P *)&period);
                  bVar1 = build_mdl(this,p_Var8,(_Fact *)CONCAT44(extraout_var_01,iVar4),
                                    (_Fact *)object,pGVar10,local_a8,(Code *)f_icst);
                  if (bVar1) {
                    _TPX::inject_hlps(&this->super__TPX,analysis_starting_time_00);
                  }
                }
                new_cst._4_4_ = 0;
              }
              Input::~Input((Input *)local_f0);
            }
            r_code::list<r_exec::Input>::const_iterator::operator++((const_iterator *)local_58);
          }
          core::P<r_exec::GuardBuilder>::~P((P<r_exec::GuardBuilder> *)&period);
          core::P<r_exec::_Fact>::~P((P<r_exec::_Fact> *)&i._list);
          core::P<r_exec::BindingMap>::~P((P<r_exec::BindingMap> *)&abstract_input);
          return;
        }
        pIVar7 = r_code::list<r_exec::Input>::const_iterator::operator->((const_iterator *)local_58)
        ;
        p_Var8 = core::P<r_exec::_Fact>::operator->(&pIVar7->input);
        (*(p_Var8->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[4])(p_Var8,0);
        sVar2 = r_code::Atom::asOpcode();
        if (sVar2 != Opcodes::Cmd) break;
        cVar13 = r_code::list<r_exec::Input>::erase
                           (&(this->super__TPX).inputs,(const_iterator *)local_58);
        local_88 = cVar13;
        r_code::list<r_exec::Input>::const_iterator::operator=((const_iterator *)local_58,&local_88)
        ;
      }
      pBVar5 = core::P<r_exec::BindingMap>::operator->((P<r_exec::BindingMap> *)&abstract_input);
      pIVar7 = r_code::list<r_exec::Input>::const_iterator::operator->((const_iterator *)local_58);
      bm = core::P::operator_cast_to_BindingMap_((P *)pIVar7);
      bVar1 = BindingMap::intersect(pBVar5,bm);
      if (bVar1) break;
LAB_0028c1ca:
      cVar13 = r_code::list<r_exec::Input>::erase
                         (&(this->super__TPX).inputs,(const_iterator *)local_58);
      guard_builder.object = (_Object *)cVar13.super__iterator._cell;
      r_code::list<r_exec::Input>::const_iterator::operator=
                ((const_iterator *)local_58,(const_iterator *)&guard_builder);
    }
    pIVar7 = r_code::list<r_exec::Input>::const_iterator::operator->((const_iterator *)local_58);
    p_Var8 = core::P<r_exec::_Fact>::operator->(&pIVar7->input);
    uVar9 = _Fact::get_after(p_Var8);
    uVar6 = _Fact::get_after((_Fact *)object);
    if (uVar6 <= uVar9) goto LAB_0028c1ca;
    r_code::list<r_exec::Input>::const_iterator::operator++((const_iterator *)local_58);
  } while( true );
}

Assistant:

void PTPX::reduce(r_exec::View *input)
{
    auto_focus->copy_cross_buffer(inputs); // the cause of the prediction failure comes before the prediction.
    uint64_t analysis_starting_time = Now();
    _Fact *consequent = new Fact((Fact *)f_imdl); // input->object is the prediction failure: ignore and consider |f->imdl instead.
    consequent->set_opposite();
    P<BindingMap> end_bm = new BindingMap();
    P<_Fact> abstract_input = (_Fact *)end_bm->abstract_object(consequent, false);
    r_code::list<Input>::const_iterator i;

    for (i = inputs.begin(); i != inputs.end();) { // filter out inputs irrelevant for the prediction.
        if (i->input->code(0).asOpcode() == Opcodes::Cmd) { // no cmds as req lhs (because no bwd-operational); prefer: cmd->effect, effect->imdl.
            i = inputs.erase(i);
        } else if (!end_bm->intersect(i->bindings) || // discard inputs that do not share values with the consequent.
                   i->input->get_after() >= consequent->get_after()) { // discard inputs younger than the consequent.
            i = inputs.erase(i);
        } else {
            ++i;
        }
    }

    P<GuardBuilder> guard_builder;
    uint64_t period;

    for (i = inputs.begin(); i != inputs.end(); ++i) {
        if (i->input->get_reference(0)->code(0).asOpcode() == Opcodes::ICst) {
            continue;    // components will be evaluated first, then the icst will be identified.
        }

        Input cause = *i;

        if (!cause.eligible_cause) {
            continue;
        }

        period = consequent->get_after() - cause.input->get_after();
        guard_builder = new TimingGuardBuilder(period); // TODO: use the durations.
        uint16_t cause_index;
        Code *new_cst;
        _Fact *f_icst = find_f_icst(cause.input, cause_index, new_cst);

        if (f_icst == nullptr) {
            if (build_mdl(cause.input, consequent, guard_builder, period)) {
                inject_hlps(analysis_starting_time);
            }
        } else {
            Code *unpacked_cst;

            if (new_cst == nullptr) {
                Code *cst = f_icst->get_reference(0)->get_reference(0);
                unpacked_cst = cst->get_reference(cst->references_size() - CST_HIDDEN_REFS); // the cst is packed, retrieve the pattern from the unpacked code.
            } else {
                unpacked_cst = new_cst;
            }

            _Fact *cause_pattern = (_Fact *)unpacked_cst->get_reference(cause_index);

            if (build_mdl(f_icst, cause_pattern, consequent, guard_builder, period, new_cst)) {
                inject_hlps(analysis_starting_time);
            }
        }
    }
}